

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xss.cpp
# Opt level: O3

tag_type __thiscall
cppcms::xss::rules_holder<cppcms::xss::icompare_c_string,_false>::valid_tag
          (rules_holder<cppcms::xss::icompare_c_string,_false> *this,c_string *t)

{
  _Rb_tree_color _Var1;
  const_iterator cVar2;
  
  cVar2 = std::
          _Rb_tree<cppcms::xss::details::c_string,_std::pair<const_cppcms::xss::details::c_string,_cppcms::xss::rules_holder<cppcms::xss::icompare_c_string,_false>::tag>,_std::_Select1st<std::pair<const_cppcms::xss::details::c_string,_cppcms::xss::rules_holder<cppcms::xss::icompare_c_string,_false>::tag>_>,_cppcms::xss::icompare_c_string,_std::allocator<std::pair<const_cppcms::xss::details::c_string,_cppcms::xss::rules_holder<cppcms::xss::icompare_c_string,_false>::tag>_>_>
          ::find(&(this->tags)._M_t,t);
  if ((_Rb_tree_header *)cVar2._M_node == &(this->tags)._M_t._M_impl.super__Rb_tree_header) {
    _Var1 = _S_red;
  }
  else {
    _Var1 = cVar2._M_node[4]._M_color;
  }
  return _Var1;
}

Assistant:

rules::tag_type valid_tag(c_string const &t) const
		{
			typename tags_type::const_iterator p = tags.find(t);
			if(p==tags.end())
				return rules::invalid_tag;
			return p->second.type;
		}